

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<int,_int>_>::relocate
          (QArrayDataPointer<std::pair<int,_int>_> *this,qsizetype offset,pair<int,_int> **data)

{
  bool bVar1;
  pair<int,_int> *first;
  long *in_RDX;
  long in_RSI;
  long in_RDI;
  pair<int,_int> *res;
  
  first = (pair<int,_int> *)(*(long *)(in_RDI + 8) + in_RSI * 8);
  QtPrivate::q_relocate_overlap_n<std::pair<int,int>,long_long>
            (first,in_RDI,(pair<int,_int> *)0x8a1bf7);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<int,int>>,std::pair<int,int>const*>
                        (data,(QArrayDataPointer<std::pair<int,_int>_> *)res), bVar1)) {
    *in_RDX = in_RSI * 8 + *in_RDX;
  }
  *(pair<int,_int> **)(in_RDI + 8) = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }